

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O3

void __thiscall Bitmap::duplicateLineDown(Bitmap *this,uint32_t y,uint32_t times)

{
  byte bVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  byte bVar8;
  ulong uVar9;
  uint32_t x;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  
  if (this->orientation == Horizontally) {
    if (times != 0) {
      uVar9 = (ulong)this->widthByte;
      iVar13 = y * this->widthByte;
      uVar7 = 1;
      do {
        iVar14 = (int)uVar9;
        iVar11 = iVar14 * uVar7 + iVar13;
        if (this->lengthByte < (uint)(iVar11 + iVar14)) {
          return;
        }
        if (iVar14 == 0) {
          uVar9 = 0;
        }
        else {
          uVar12 = 0;
          do {
            this->data[(uint)(iVar11 + (int)uVar12)] = this->data[(uint)(iVar13 + (int)uVar12)];
            uVar12 = uVar12 + 1;
            uVar9 = (ulong)this->widthByte;
          } while (uVar12 < uVar9);
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 <= times);
    }
  }
  else {
    uVar2 = this->height;
    if (uVar2 != 0) {
      uVar7 = 2;
      if (2 < times + 1) {
        uVar7 = times + 1;
      }
      x = 0;
      do {
        uVar3 = getPixelIndex(this,x,y);
        uVar6 = 0;
        if (uVar3 < (uint)this->length) {
          uVar6 = uVar3 + 7;
          if (-1 < (int)uVar3) {
            uVar6 = uVar3;
          }
          uVar6 = (uint)this->data[(int)uVar6 >> 3];
        }
        if (times != 0) {
          iVar13 = y + 1;
          iVar14 = uVar7 - 1;
          do {
            uVar4 = getPixelIndex(this,x,iVar13);
            if (uVar4 < (uint)this->length) {
              bVar5 = (byte)uVar4 & 7;
              uVar10 = uVar4 + 7;
              if (-1 < (int)uVar4) {
                uVar10 = uVar4;
              }
              bVar1 = this->data[(int)uVar10 >> 3];
              bVar8 = (byte)(0x80 >> bVar5) | bVar1;
              if ((uVar6 & 0x80U >> ((byte)uVar3 & 7)) == 0) {
                bVar8 = (byte)(-0x81 >> bVar5) & bVar1;
              }
              this->data[(int)uVar10 >> 3] = bVar8;
            }
            iVar13 = iVar13 + 1;
            iVar14 = iVar14 + -1;
          } while (iVar14 != 0);
        }
        x = x + 1;
      } while (x != uVar2);
    }
  }
  return;
}

Assistant:

void Bitmap::duplicateLineDown(const uint32_t y, const uint32_t times)
{
#if 1
   if (orientation == Orientation::Horizontally)
   {
      //for horizontal orientation, this operation can be done very efficient just coping bytes
      uint32_t origin = y * this->widthByte;
      for (uint32_t i = 1; i <= times; ++i)
      {
         uint32_t line = i*this->widthByte + origin;
         if (line + this->widthByte <= this->lengthByte) //preven buffer overflow
         {
            for (uint32_t j = 0; j < this->widthByte; ++j)
            {
               this->data[line + j] = this->data[origin + j];
            }
            continue;
         }
         break;
      }
   }
   else //Vertically
#endif
   {
      //for vertical orientation, this must be done plain... (pixel by pixel)
      uint32_t xend = (orientation == Orientation::Horizontally) ? this->width : this->height; //but can also be done for horizontal orientation
      for (uint32_t x = 0; x < xend; ++x)
      {
         uint32_t sourcePixel = getPixelIndex(x, y);
         bool value = getPixelValue(sourcePixel);
         for (uint32_t i = 1; i <= times; ++i)
         {
            uint32_t destinationPixel = getPixelIndex(x, y+i);
            setPixelValue(destinationPixel, value);
         }
      }
   }
}